

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

string * __thiscall
cmLocalUnixMakefileGenerator3::MaybeConvertWatcomShellCommand
          (string *__return_storage_ptr__,cmLocalUnixMakefileGenerator3 *this,string *cmd)

{
  bool bVar1;
  char *in_name;
  long lVar2;
  undefined1 local_40 [8];
  string scmd;
  string *cmd_local;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  scmd.field_2._8_8_ = cmd;
  bVar1 = cmLocalGenerator::IsWatcomWMake((cmLocalGenerator *)this);
  if (bVar1) {
    in_name = (char *)std::__cxx11::string::c_str();
    bVar1 = cmsys::SystemTools::FileIsFullPath(in_name);
    if ((bVar1) &&
       (lVar2 = std::__cxx11::string::find_first_of((char *)scmd.field_2._8_8_,0xa2b677),
       lVar2 != -1)) {
      std::__cxx11::string::string((string *)local_40);
      bVar1 = cmsys::SystemTools::GetShortPath((string *)scmd.field_2._8_8_,(string *)local_40);
      if (bVar1) {
        cmOutputConverter::ConvertToOutputFormat
                  (__return_storage_ptr__,
                   &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,(string *)local_40,SHELL);
      }
      std::__cxx11::string::~string((string *)local_40);
      if (bVar1) {
        return __return_storage_ptr__;
      }
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalUnixMakefileGenerator3::MaybeConvertWatcomShellCommand(
  std::string const& cmd)
{
  if (this->IsWatcomWMake() && cmSystemTools::FileIsFullPath(cmd.c_str()) &&
      cmd.find_first_of("( )") != std::string::npos) {
    // On Watcom WMake use the windows short path for the command
    // name.  This is needed to avoid funny quoting problems on
    // lines with shell redirection operators.
    std::string scmd;
    if (cmSystemTools::GetShortPath(cmd, scmd)) {
      return this->ConvertToOutputFormat(scmd, cmOutputConverter::SHELL);
    }
  }
  return std::string();
}